

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::remove_duplicates
          (xpath_node_set_raw *this,xpath_allocator *alloc)

{
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  uint uVar3;
  ulong uVar4;
  void *__s;
  long lVar5;
  xpath_node *pxVar6;
  bool bVar7;
  xpath_node *pxVar8;
  xpath_node *pxVar9;
  ulong uVar10;
  ulong uVar11;
  xml_node_struct *pxVar12;
  xpath_allocator_capture cr;
  xml_node local_58;
  xpath_allocator_capture local_50;
  
  if ((this->_type == type_unsorted) &&
     (uVar4 = (long)this->_end - (long)this->_begin, 0x20 < (long)uVar4)) {
    local_50._state._root = alloc->_root;
    local_50._state._root_size = alloc->_root_size;
    local_50._state._error = alloc->_error;
    uVar10 = 1;
    do {
      uVar11 = uVar10;
      uVar10 = uVar11 * 2;
    } while (uVar11 < (uVar4 >> 5) + (uVar4 >> 4));
    local_50._target = alloc;
    __s = xpath_allocator::allocate(alloc,uVar11 * 8);
    if (__s != (void *)0x0) {
      memset(__s,0,uVar11 * 8);
      pxVar9 = this->_begin;
      if (pxVar9 != this->_end) {
        uVar11 = uVar11 - 1;
        pxVar8 = pxVar9;
        do {
          pxVar12 = (xml_node_struct *)(pxVar8->_attribute)._attr;
          if (pxVar12 == (xml_node_struct *)0x0) {
            pxVar12 = (pxVar8->_node)._root;
            local_58._root = pxVar12;
          }
          else {
            xml_node::xml_node(&local_58);
          }
          if (pxVar12 != (xml_node_struct *)0x0) {
            uVar3 = ((uint)((ulong)pxVar12 >> 0x10) & 0xffff ^ (uint)pxVar12) * -0x7a143595;
            uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
            uVar4 = (ulong)((uVar3 >> 0x10 ^ uVar3) & (uint)uVar11);
            bVar7 = false;
            uVar10 = 0;
            do {
              pxVar1 = *(xml_node_struct **)((long)__s + uVar4 * 8);
              if (pxVar1 == (xml_node_struct *)0x0) {
                *(xml_node_struct **)((long)__s + uVar4 * 8) = pxVar12;
                break;
              }
              if (pxVar1 == pxVar12) break;
              lVar5 = uVar4 + uVar10;
              uVar10 = uVar10 + 1;
              uVar4 = lVar5 + 1U & uVar11;
              bVar7 = uVar11 < uVar10;
            } while (uVar10 <= uVar11);
            if (bVar7) {
              __assert_fail("false && \"Hash table is full\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/pugixml.cpp"
                            ,0x1e85,
                            "bool pugi::impl::(anonymous namespace)::hash_insert(const void **, size_t, const void *)"
                           );
            }
            if (pxVar1 == (xml_node_struct *)0x0) {
              pxVar2 = (pxVar8->_attribute)._attr;
              (pxVar9->_node)._root = (pxVar8->_node)._root;
              (pxVar9->_attribute)._attr = pxVar2;
              pxVar9 = pxVar9 + 1;
            }
          }
          pxVar8 = pxVar8 + 1;
        } while (pxVar8 != this->_end);
      }
      this->_end = pxVar9;
    }
    xpath_allocator_capture::~xpath_allocator_capture(&local_50);
  }
  else {
    pxVar9 = this->_end;
    lVar5 = (long)pxVar9 - (long)this->_begin;
    pxVar8 = this->_begin + 1;
    do {
      pxVar6 = pxVar8;
      if (lVar5 < 0x11) break;
      lVar5 = lVar5 + -0x10;
      pxVar8 = pxVar6 + 1;
    } while ((pxVar6[-1]._node._root != (pxVar6->_node)._root) ||
            (pxVar6[-1]._attribute._attr != (pxVar6->_attribute)._attr));
    pxVar8 = pxVar6 + -1;
    if (pxVar8 != pxVar9) {
      for (; pxVar6 != pxVar9; pxVar6 = pxVar6 + 1) {
        if (((pxVar6->_node)._root != (pxVar8->_node)._root) ||
           ((pxVar6->_attribute)._attr != (pxVar8->_attribute)._attr)) {
          pxVar2 = (pxVar6->_attribute)._attr;
          pxVar8[1]._node._root = (pxVar6->_node)._root;
          pxVar8[1]._attribute._attr = pxVar2;
          pxVar8 = pxVar8 + 1;
        }
      }
      pxVar8 = pxVar8 + 1;
    }
    this->_end = pxVar8;
  }
  return;
}

Assistant:

void remove_duplicates(xpath_allocator* alloc)
		{
			if (_type == xpath_node_set::type_unsorted && _end - _begin > 2)
			{
				xpath_allocator_capture cr(alloc);

				size_t size_ = static_cast<size_t>(_end - _begin);

				size_t hash_size = 1;
				while (hash_size < size_ + size_ / 2) hash_size *= 2;

				const void** hash_data = static_cast<const void**>(alloc->allocate(hash_size * sizeof(void**)));
				if (!hash_data) return;

				memset(hash_data, 0, hash_size * sizeof(const void**));

				xpath_node* write = _begin;

				for (xpath_node* it = _begin; it != _end; ++it)
				{
					const void* attr = it->attribute().internal_object();
					const void* node = it->node().internal_object();
					const void* key = attr ? attr : node;

					if (key && hash_insert(hash_data, hash_size, key))
					{
						*write++ = *it;
					}
				}

				_end = write;
			}
			else
			{
				_end = unique(_begin, _end);
			}
		}